

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O3

void Aig_ManSupportNodes_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Int_t *vSupport)

{
  int iVar1;
  
  iVar1 = p->nTravIds;
  if (pObj->TravId != iVar1) {
    do {
      pObj->TravId = iVar1;
      if ((*(uint *)&pObj->field_0x18 & 7) == 2) {
        Vec_IntPush(vSupport,(pObj->field_0).CioId);
        return;
      }
      Aig_ManSupportNodes_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vSupport);
      pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
      iVar1 = p->nTravIds;
    } while (pObj->TravId != iVar1);
  }
  return;
}

Assistant:

void Aig_ManSupportNodes_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Int_t * vSupport )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsCi(pObj) )
    {
        Vec_IntPush( vSupport, Aig_ObjCioId(pObj) );
        return;
    }
    Aig_ManSupportNodes_rec( p, Aig_ObjFanin0(pObj), vSupport );
    Aig_ManSupportNodes_rec( p, Aig_ObjFanin1(pObj), vSupport );
}